

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.h
# Opt level: O0

void __thiscall FactorisedJoin::PartitionAttributes::~PartitionAttributes(PartitionAttributes *this)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  vector<double,_std::allocator<double>_> *this_00;
  undefined8 *in_RDI;
  size_t i;
  vector<node::Union_*,_std::allocator<node::Union_*>_> *in_stack_ffffffffffffff70;
  ulong local_10;
  
  for (local_10 = 0; local_10 < dfdb::params::NUM_OF_ATTRIBUTES; local_10 = local_10 + 1) {
    pvVar1 = *(void **)(in_RDI[3] + local_10 * 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
    pvVar1 = *(void **)(in_RDI[1] + local_10 * 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
    pvVar1 = *(void **)(in_RDI[2] + local_10 * 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
    pvVar1 = *(void **)(in_RDI[4] + local_10 * 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
  }
  if ((void *)in_RDI[3] != (void *)0x0) {
    operator_delete__((void *)in_RDI[3]);
  }
  if ((void *)in_RDI[1] != (void *)0x0) {
    operator_delete__((void *)in_RDI[1]);
  }
  if ((void *)in_RDI[2] != (void *)0x0) {
    operator_delete__((void *)in_RDI[2]);
  }
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete__((void *)*in_RDI);
  }
  lVar2 = in_RDI[5];
  if (lVar2 != 0) {
    for (lVar3 = lVar2 + *(long *)(lVar2 + -8) * 0x18; lVar2 != lVar3; lVar3 = lVar3 + -0x18) {
      std::vector<node::Union_*,_std::allocator<node::Union_*>_>::~vector(in_stack_ffffffffffffff70)
      ;
    }
    operator_delete__((void *)(lVar2 + -8));
  }
  lVar2 = in_RDI[6];
  if (lVar2 != 0) {
    this_00 = (vector<double,_std::allocator<double>_> *)(lVar2 + -8);
    for (lVar3 = lVar2 + *(long *)(lVar2 + -8) * 0x18; lVar2 != lVar3; lVar3 = lVar3 + -0x18) {
      std::vector<double,_std::allocator<double>_>::~vector(this_00);
    }
    operator_delete__(this_00);
  }
  if ((void *)in_RDI[4] != (void *)0x0) {
    operator_delete__((void *)in_RDI[4]);
  }
  return;
}

Assistant:

~PartitionAttributes()
		{
			for (size_t i = 0; i < dfdb::params::NUM_OF_ATTRIBUTES; ++i)
			{
				delete[] ordering[i];
				delete[] LOWERBOUND[i];
				delete[] UPPERBOUND[i];
				delete[] localPointerPlaceholder[i];
			}

			delete[] ordering;
			delete[] LOWERBOUND;
			delete[] UPPERBOUND;
			delete[] varMap;

			delete[] pointers;
			delete[] values;
			delete[] localPointerPlaceholder;
		}